

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O3

void sv_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  long lVar2;
  undefined8 *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  uv_udp_send_t *puVar4;
  int in_R8D;
  
  lVar3 = CONCAT44(in_register_00000034,status);
  if (req == (uv_udp_send_t *)0x0) {
    sv_send_cb_cold_3();
    puVar4 = req;
LAB_0017c1c2:
    sv_send_cb_cold_1();
  }
  else {
    puVar4 = req;
    if (status != 0) goto LAB_0017c1c2;
    puVar4 = (uv_udp_send_t *)req->handle;
    if (puVar4 == (uv_udp_send_t *)&client || puVar4 == (uv_udp_send_t *)&server) {
      uv_close(puVar4,close_cb);
      free(req);
      sv_send_cb_called = sv_send_cb_called + 1;
      return;
    }
  }
  sv_send_cb_cold_2();
  lVar2 = CONCAT71(0x5688,puVar4 == (uv_udp_send_t *)&client || puVar4 == (uv_udp_send_t *)&server);
  if (puVar4 == (uv_udp_send_t *)&client || puVar4 == (uv_udp_send_t *)&server) {
    iVar1 = uv_is_closing();
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  if (puVar4 == (uv_udp_send_t *)&client || puVar4 == (uv_udp_send_t *)&server) {
    if (in_R8D != 0) goto LAB_0017c269;
    if (lVar3 < 0) goto LAB_0017c26e;
    if (lVar3 == 0) {
      if (lVar2 == 0) {
        return;
      }
      goto LAB_0017c282;
    }
    if (lVar2 == 0) goto LAB_0017c273;
    if (lVar3 != 4) goto LAB_0017c278;
    if (*(int *)*extraout_RDX == 0x474e4f50) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close();
      return;
    }
  }
  else {
    cl_recv_cb_cold_1();
LAB_0017c269:
    cl_recv_cb_cold_2();
LAB_0017c26e:
    cl_recv_cb_cold_7();
LAB_0017c273:
    cl_recv_cb_cold_5();
LAB_0017c278:
    cl_recv_cb_cold_3();
  }
  cl_recv_cb_cold_4();
LAB_0017c282:
  cl_recv_cb_cold_6();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar4,0);
  return;
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  uv_close((uv_handle_t*) req->handle, close_cb);
  free(req);

  sv_send_cb_called++;
}